

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseThunkFinallyFunction::JavascriptPromiseThunkFinallyFunction
          (JavascriptPromiseThunkFinallyFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          Var value,bool shouldThrow)

{
  bool shouldThrow_local;
  Var value_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptPromiseThunkFinallyFunction *this_local;
  
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dd5440;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->value,value);
  this->shouldThrow = shouldThrow;
  return;
}

Assistant:

JavascriptPromiseThunkFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, Var value, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), value(value), shouldThrow(shouldThrow)
        { }